

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void lj_dispatch_update(global_State *g)

{
  undefined4 *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  GCRef GVar8;
  GCRef GVar9;
  GCRef GVar10;
  long lVar11;
  uint uVar12;
  code *pcVar13;
  uint uVar14;
  code *pcVar15;
  code *pcVar16;
  ushort *puVar17;
  ushort *puVar18;
  uint uVar19;
  uint uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  long lVar24;
  
  uVar6 = (uint)g[1].gc.freed;
  iVar7 = *(int *)((long)&g[1].gc.tabnum + 4);
  uVar14 = (uVar6 & 1) << 4;
  uVar19 = 0x25;
  if (iVar7 == 0) {
    uVar19 = 0;
  }
  bVar2 = g->hookmask;
  uVar12 = 0x44;
  if (-1 < (char)bVar2) {
    uVar12 = (uint)((bVar2 & 0xc) != 0) << 2;
  }
  bVar3 = g->dispatchmode;
  uVar12 = uVar12 | uVar19 | uVar14;
  uVar20 = bVar2 & 3 | uVar12;
  if (uVar20 == bVar3) {
    return;
  }
  g->dispatchmode = (uint8_t)uVar20;
  if ((uVar19 & 0x30 | uVar14) == 0x10) {
    pcVar13 = lj_BC_FORL;
    pcVar15 = lj_BC_ITERL;
    pcVar16 = lj_BC_LOOP;
    puVar17 = lj_bc_ofs + 0x5c;
    puVar18 = lj_bc_ofs + 0x59;
  }
  else {
    pcVar13 = *(code **)(g[8].gcroot + 0x18);
    pcVar15 = *(code **)(g[8].gcroot + 0x1e);
    pcVar16 = *(code **)(g[8].gcroot + 0x24);
    puVar17 = lj_bc_ofs + 0x5d;
    puVar18 = lj_bc_ofs + 0x5a;
  }
  uVar4 = *puVar17;
  uVar5 = *puVar18;
  *(code **)(g[8].gcroot + 0x16) = pcVar13;
  *(code **)(g[8].gcroot + 0x1c) = pcVar15;
  *(code **)(g[8].gcroot + 0x22) = pcVar16;
  auVar23 = _DAT_0015d420;
  uVar19 = uVar20 ^ bVar3;
  if ((uVar19 & 100) == 0) {
    if ((uVar12 & 4) == 0) {
      *(code **)(g[6].gcroot + 6) = pcVar13;
      *(code **)(g[6].gcroot + 0xc) = pcVar15;
      *(code **)(g[6].gcroot + 0x12) = pcVar16;
      if ((bVar2 & 2) != 0) goto LAB_00112f83;
      GVar8.gcptr32 = g[8].gcroot[0xb].gcptr32;
      GVar9.gcptr32 = g[8].gcroot[0xc].gcptr32;
      GVar10.gcptr32 = g[8].gcroot[0xd].gcptr32;
      g[6].bc_cfunc_int = g[8].gcroot[10].gcptr32;
      g[6].bc_cfunc_ext = GVar8.gcptr32;
      g[6].cur_L = (GCRef)GVar9.gcptr32;
      g[6].mem_L = (GCRef)GVar10.gcptr32;
      GVar8.gcptr32 = g[8].gcroot[0xf].gcptr32;
      g[6].jit_base = (MRef)g[8].gcroot[0xe].gcptr32;
      g[6].ctype_state = (MRef)GVar8.gcptr32;
      pcVar13 = *(code **)(g[8].gcroot + 0x10);
LAB_00112f9f:
      *(code **)g[6].gcroot = pcVar13;
    }
  }
  else if ((uVar12 & 4) == 0) {
    memcpy(&g[5].bc_cfunc_int,g[7].gcroot + 10,0x2c8);
    if ((bVar2 & 2) != 0) {
LAB_00112f83:
      pcVar13 = lj_vm_rethook;
      *(code **)&g[6].bc_cfunc_int = lj_vm_rethook;
      *(code **)&g[6].cur_L = lj_vm_rethook;
      *(code **)&g[6].jit_base = lj_vm_rethook;
      goto LAB_00112f9f;
    }
  }
  else {
    pcVar13 = lj_vm_record;
    if (iVar7 == 0) {
      pcVar13 = lj_vm_inshook;
    }
    pcVar15 = lj_vm_profhook;
    if (-1 < (char)bVar2) {
      pcVar15 = pcVar13;
    }
    lVar11 = 0;
    auVar22 = _DAT_0015d410;
    do {
      if (SUB164(auVar22 ^ auVar23,4) == -0x80000000 && SUB164(auVar22 ^ auVar23,0) < -0x7fffffa7) {
        *(code **)(g[5].gcroot + lVar11 * 2 + -6) = pcVar15;
        *(code **)(g[5].gcroot + lVar11 * 2 + -4) = pcVar15;
      }
      lVar11 = lVar11 + 2;
      lVar24 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar24 + 2;
    } while (lVar11 != 0x5a);
  }
  auVar22 = _DAT_0015d420;
  auVar23 = _DAT_0015d410;
  if ((uVar19 & 1) == 0) {
    if ((uVar20 & 1) != 0) goto LAB_00113070;
  }
  else {
    lVar11 = 0;
    if ((uVar20 & 1) != 0) {
      do {
        auVar25._8_4_ = (int)lVar11;
        auVar25._0_8_ = lVar11;
        auVar25._12_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar25 = (auVar25 | auVar23) ^ auVar22;
        if (auVar25._4_4_ == -0x80000000 && auVar25._0_4_ < -0x7fffffbf) {
          *(code **)(g[6].gcroot + lVar11 * 2 + 0x1a) = lj_vm_callhook;
          *(code **)(g[6].gcroot + lVar11 * 2 + 0x1c) = lj_vm_callhook;
        }
        lVar11 = lVar11 + 2;
      } while (lVar11 != 0x42);
      goto LAB_00113070;
    }
    do {
      *(code **)(g[6].gcroot + lVar11 * 2 + 0x1a) = lj_BC_ISLT + lj_bc_ofs[lVar11 + 0x59];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x41);
  }
  *(code **)(g[6].gcroot + 0x1a) = lj_BC_ISLT + uVar5;
  *(code **)(g[6].gcroot + 0x20) = lj_BC_ISLT + uVar4;
LAB_00113070:
  if ((char)((bVar3 & 0x10) >> 4) == '\0' && (uVar6 & 1) != 0) {
    auVar23 = ZEXT416(g[3].gcroot[0xd].gcptr32 * 2 - 1);
    auVar23 = pshuflw(auVar23,auVar23,0);
    uVar21 = auVar23._0_4_;
    lVar11 = 0;
    do {
      puVar1 = (undefined4 *)((long)&g[5].strempty.hash + lVar11 * 2);
      *puVar1 = uVar21;
      puVar1[1] = uVar21;
      puVar1[2] = uVar21;
      puVar1[3] = uVar21;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x40);
  }
  return;
}

Assistant:

void lj_dispatch_update(global_State *g)
{
  uint8_t oldmode = g->dispatchmode;
  uint8_t mode = 0;
#if LJ_HASJIT
  mode |= (G2J(g)->flags & JIT_F_ON) ? DISPMODE_JIT : 0;
  mode |= G2J(g)->state != LJ_TRACE_IDLE ?
	    (DISPMODE_REC|DISPMODE_INS|DISPMODE_CALL) : 0;
#endif
#if LJ_HASPROFILE
  mode |= (g->hookmask & HOOK_PROFILE) ? (DISPMODE_PROF|DISPMODE_INS) : 0;
#endif
  mode |= (g->hookmask & (LUA_MASKLINE|LUA_MASKCOUNT)) ? DISPMODE_INS : 0;
  mode |= (g->hookmask & LUA_MASKCALL) ? DISPMODE_CALL : 0;
  mode |= (g->hookmask & LUA_MASKRET) ? DISPMODE_RET : 0;
  if (oldmode != mode) {  /* Mode changed? */
    ASMFunction *disp = G2GG(g)->dispatch;
    ASMFunction f_forl, f_iterl, f_loop, f_funcf, f_funcv;
    g->dispatchmode = mode;

    /* Hotcount if JIT is on, but not while recording. */
    if ((mode & (DISPMODE_JIT|DISPMODE_REC)) == DISPMODE_JIT) {
      f_forl = makeasmfunc(lj_bc_ofs[BC_FORL]);
      f_iterl = makeasmfunc(lj_bc_ofs[BC_ITERL]);
      f_loop = makeasmfunc(lj_bc_ofs[BC_LOOP]);
      f_funcf = makeasmfunc(lj_bc_ofs[BC_FUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_FUNCV]);
    } else {  /* Otherwise use the non-hotcounting instructions. */
      f_forl = disp[GG_LEN_DDISP+BC_IFORL];
      f_iterl = disp[GG_LEN_DDISP+BC_IITERL];
      f_loop = disp[GG_LEN_DDISP+BC_ILOOP];
      f_funcf = makeasmfunc(lj_bc_ofs[BC_IFUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_IFUNCV]);
    }
    /* Init static counting instruction dispatch first (may be copied below). */
    disp[GG_LEN_DDISP+BC_FORL] = f_forl;
    disp[GG_LEN_DDISP+BC_ITERL] = f_iterl;
    disp[GG_LEN_DDISP+BC_LOOP] = f_loop;

    /* Set dynamic instruction dispatch. */
    if ((oldmode ^ mode) & (DISPMODE_PROF|DISPMODE_REC|DISPMODE_INS)) {
      /* Need to update the whole table. */
      if (!(mode & DISPMODE_INS)) {  /* No ins dispatch? */
	/* Copy static dispatch table to dynamic dispatch table. */
	memcpy(&disp[0], &disp[GG_LEN_DDISP], GG_LEN_SDISP*sizeof(ASMFunction));
	/* Overwrite with dynamic return dispatch. */
	if ((mode & DISPMODE_RET)) {
	  disp[BC_RETM] = lj_vm_rethook;
	  disp[BC_RET] = lj_vm_rethook;
	  disp[BC_RET0] = lj_vm_rethook;
	  disp[BC_RET1] = lj_vm_rethook;
	}
      } else {
	/* The recording dispatch also checks for hooks. */
	ASMFunction f = (mode & DISPMODE_PROF) ? lj_vm_profhook :
			(mode & DISPMODE_REC) ? lj_vm_record : lj_vm_inshook;
	uint32_t i;
	for (i = 0; i < GG_LEN_SDISP; i++)
	  disp[i] = f;
      }
    } else if (!(mode & DISPMODE_INS)) {
      /* Otherwise set dynamic counting ins. */
      disp[BC_FORL] = f_forl;
      disp[BC_ITERL] = f_iterl;
      disp[BC_LOOP] = f_loop;
      /* Set dynamic return dispatch. */
      if ((mode & DISPMODE_RET)) {
	disp[BC_RETM] = lj_vm_rethook;
	disp[BC_RET] = lj_vm_rethook;
	disp[BC_RET0] = lj_vm_rethook;
	disp[BC_RET1] = lj_vm_rethook;
      } else {
	disp[BC_RETM] = disp[GG_LEN_DDISP+BC_RETM];
	disp[BC_RET] = disp[GG_LEN_DDISP+BC_RET];
	disp[BC_RET0] = disp[GG_LEN_DDISP+BC_RET0];
	disp[BC_RET1] = disp[GG_LEN_DDISP+BC_RET1];
      }
    }

    /* Set dynamic call dispatch. */
    if ((oldmode ^ mode) & DISPMODE_CALL) {  /* Update the whole table? */
      uint32_t i;
      if ((mode & DISPMODE_CALL) == 0) {  /* No call hooks? */
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = makeasmfunc(lj_bc_ofs[i]);
      } else {
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = lj_vm_callhook;
      }
    }
    if (!(mode & DISPMODE_CALL)) {  /* Overwrite dynamic counting ins. */
      disp[BC_FUNCF] = f_funcf;
      disp[BC_FUNCV] = f_funcv;
    }

#if LJ_HASJIT
    /* Reset hotcounts for JIT off to on transition. */
    if ((mode & DISPMODE_JIT) && !(oldmode & DISPMODE_JIT))
      lj_dispatch_init_hotcount(g);
#endif
  }
}